

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int xmlHashUpdateEntry3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                       void *userdata,xmlHashDeallocator f)

{
  _xmlHashEntry *p_Var1;
  int iVar2;
  int iVar3;
  unsigned_long uVar4;
  _xmlHashEntry *p_Var5;
  xmlChar *pxVar6;
  _xmlHashEntry *p_Var7;
  
  if (name == (xmlChar *)0x0 || table == (xmlHashTablePtr)0x0) {
    return -1;
  }
  if (table->dict != (xmlDictPtr)0x0) {
    iVar2 = xmlDictOwns(table->dict,name);
    if ((iVar2 == 0) && (name = xmlDictLookup(table->dict,name,-1), name == (xmlChar *)0x0)) {
      return -1;
    }
    if (name2 == (xmlChar *)0x0) {
      name2 = (xmlChar *)0x0;
    }
    else {
      iVar2 = xmlDictOwns(table->dict,name2);
      if ((iVar2 == 0) && (name2 = xmlDictLookup(table->dict,name2,-1), name2 == (xmlChar *)0x0)) {
        return -1;
      }
    }
    if (name3 == (xmlChar *)0x0) {
      name3 = (xmlChar *)0x0;
    }
    else {
      iVar2 = xmlDictOwns(table->dict,name3);
      if ((iVar2 == 0) && (name3 = xmlDictLookup(table->dict,name3,-1), name3 == (xmlChar *)0x0)) {
        return -1;
      }
    }
  }
  uVar4 = xmlHashComputeKey(table,name,name2,name3);
  p_Var5 = table->table + uVar4;
  iVar2 = table->table[uVar4].valid;
  if (iVar2 == 0) {
    p_Var7 = (_xmlHashEntry *)0x0;
    goto LAB_001498ad;
  }
  p_Var1 = p_Var5->next;
  p_Var7 = p_Var5;
  if (table->dict == (xmlDictPtr)0x0) {
    while (p_Var1 != (_xmlHashEntry *)0x0) {
      iVar3 = xmlStrEqual(p_Var7->name,name);
      if (((iVar3 != 0) && (iVar3 = xmlStrEqual(p_Var7->name2,name2), iVar3 != 0)) &&
         (iVar3 = xmlStrEqual(p_Var7->name3,name3), iVar3 != 0)) goto LAB_00149866;
      p_Var1 = p_Var7->next->next;
      p_Var7 = p_Var7->next;
    }
    iVar3 = xmlStrEqual(p_Var7->name,name);
    if (((iVar3 != 0) && (iVar3 = xmlStrEqual(p_Var7->name2,name2), iVar3 != 0)) &&
       (iVar3 = xmlStrEqual(p_Var7->name3,name3), iVar3 != 0)) {
LAB_00149866:
      if (f == (xmlHashDeallocator)0x0) goto LAB_0014987a;
      pxVar6 = p_Var7->name;
      goto LAB_00149874;
    }
  }
  else {
    while (p_Var5 = p_Var1, p_Var5 != (_xmlHashEntry *)0x0) {
      if (((p_Var7->name == name) && (p_Var7->name2 == name2)) && (p_Var7->name3 == name3)) {
        if (f != (xmlHashDeallocator)0x0) {
          (*f)(p_Var7->payload,p_Var7->name);
        }
        p_Var7->payload = userdata;
        return 0;
      }
      p_Var7 = p_Var5;
      p_Var1 = p_Var5->next;
    }
    pxVar6 = p_Var7->name;
    if (((pxVar6 == name) && (p_Var7->name2 == name2)) && (p_Var7->name3 == name3)) {
      if (f == (xmlHashDeallocator)0x0) goto LAB_0014987a;
LAB_00149874:
      (*f)(p_Var7->payload,pxVar6);
LAB_0014987a:
      p_Var7->payload = userdata;
      return 0;
    }
  }
  p_Var5 = (_xmlHashEntry *)(*xmlMalloc)(0x30);
  if (p_Var5 == (_xmlHashEntry *)0x0) {
    return -1;
  }
LAB_001498ad:
  if (table->dict == (xmlDictPtr)0x0) {
    pxVar6 = xmlStrdup(name);
    p_Var5->name = pxVar6;
    pxVar6 = xmlStrdup(name2);
    p_Var5->name2 = pxVar6;
    name3 = xmlStrdup(name3);
  }
  else {
    p_Var5->name = name;
    p_Var5->name2 = name2;
  }
  p_Var5->name3 = name3;
  p_Var5->payload = userdata;
  p_Var5->next = (_xmlHashEntry *)0x0;
  p_Var5->valid = 1;
  table->nbElems = table->nbElems + 1;
  if (iVar2 != 0) {
    p_Var7->next = p_Var5;
  }
  return 0;
}

Assistant:

int
xmlHashUpdateEntry3(xmlHashTablePtr table, const xmlChar *name,
	           const xmlChar *name2, const xmlChar *name3,
		   void *userdata, xmlHashDeallocator f) {
    unsigned long key;
    xmlHashEntryPtr entry;
    xmlHashEntryPtr insert;

    if ((table == NULL) || name == NULL)
	return(-1);

    /*
     * If using a dict internalize if needed
     */
    if (table->dict) {
        if (!xmlDictOwns(table->dict, name)) {
	    name = xmlDictLookup(table->dict, name, -1);
	    if (name == NULL)
	        return(-1);
	}
        if ((name2 != NULL) && (!xmlDictOwns(table->dict, name2))) {
	    name2 = xmlDictLookup(table->dict, name2, -1);
	    if (name2 == NULL)
	        return(-1);
	}
        if ((name3 != NULL) && (!xmlDictOwns(table->dict, name3))) {
	    name3 = xmlDictLookup(table->dict, name3, -1);
	    if (name3 == NULL)
	        return(-1);
	}
    }

    /*
     * Check for duplicate and insertion location.
     */
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0) {
	insert = NULL;
    } else {
        if (table ->dict) {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((insert->name == name) &&
		    (insert->name2 == name2) &&
		    (insert->name3 == name3)) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((insert->name == name) &&
		(insert->name2 == name2) &&
		(insert->name3 == name3)) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	} else {
	    for (insert = &(table->table[key]); insert->next != NULL;
		 insert = insert->next) {
		if ((xmlStrEqual(insert->name, name)) &&
		    (xmlStrEqual(insert->name2, name2)) &&
		    (xmlStrEqual(insert->name3, name3))) {
		    if (f)
			f(insert->payload, insert->name);
		    insert->payload = userdata;
		    return(0);
		}
	    }
	    if ((xmlStrEqual(insert->name, name)) &&
		(xmlStrEqual(insert->name2, name2)) &&
		(xmlStrEqual(insert->name3, name3))) {
		if (f)
		    f(insert->payload, insert->name);
		insert->payload = userdata;
		return(0);
	    }
	}
    }

    if (insert == NULL) {
	entry =  &(table->table[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlHashEntry));
	if (entry == NULL)
	     return(-1);
    }

    if (table->dict != NULL) {
        entry->name = (xmlChar *) name;
        entry->name2 = (xmlChar *) name2;
        entry->name3 = (xmlChar *) name3;
    } else {
	entry->name = xmlStrdup(name);
	entry->name2 = xmlStrdup(name2);
	entry->name3 = xmlStrdup(name3);
    }
    entry->payload = userdata;
    entry->next = NULL;
    entry->valid = 1;
    table->nbElems++;


    if (insert != NULL) {
	insert->next = entry;
    }
    return(0);
}